

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

void group_objects_internal
               (Am_Object *cmd,Am_Object *selection_widget,Am_Value_List *selected_objs,
               Am_Object *group)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Value *in_value;
  Am_Object *prev;
  Am_Value_List *this;
  Am_Object new_group;
  Am_Value_List local_88;
  Am_Object place;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object prototype;
  Am_Value_List selected_objs_places;
  Am_Value_List local_30;
  
  new_group.data = (Am_Object_Data *)0x0;
  place.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&selected_objs_places);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(selected_objs);
  Am_Object::Set(cmd,0x16d,pAVar2,0);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(group);
  Am_Object::Set(cmd,0x171,pAVar2,0);
  Am_Object::Set(cmd,0x16f,false,0);
  in_value = Am_Object::Get(cmd,0xa5,0);
  Am_Object::Am_Object(&prototype,in_value);
  Am_Object::Create((Am_Object *)&local_88,(char *)&prototype);
  prev = Am_Object::Set((Am_Object *)&local_88,0x1e6,true,1);
  Am_Object::operator=(&new_group,prev);
  Am_Object::~Am_Object((Am_Object *)&local_88);
  Am_Value_List::Am_Value_List(&local_30,selected_objs);
  Am_Object::Am_Object(&local_50,group);
  Am_Object::Am_Object(&local_58,&new_group);
  put_objects_into_group(&local_88,&local_30,(Am_Object *)&selected_objs_places,&local_50);
  Am_Object::operator=(&place,(Am_Object *)&local_88);
  Am_Object::~Am_Object((Am_Object *)&local_88);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_50);
  Am_Value_List::~Am_Value_List(&local_30);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&selected_objs_places);
  Am_Object::Set(cmd,0x1e4,pAVar2,0);
  Am_Object::Am_Object(&local_60,&new_group);
  Am_Object::Add_Part(group,&local_60,true,0);
  Am_Object::~Am_Object(&local_60);
  bVar1 = Am_Object::Valid(&place);
  if (bVar1) {
    Am_Object::Am_Object(&local_68,&new_group);
    Am_Object::Am_Object(&local_70,&place);
    Am_Move_Object(&local_68,&local_70,false);
    Am_Object::~Am_Object(&local_70);
    Am_Object::~Am_Object(&local_68);
  }
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&new_group);
  Am_Object::Set(cmd,0x169,pAVar2,0);
  Am_Value_List::Am_Value_List(&local_88);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&new_group);
  this = Am_Value_List::Add(&local_88,pAVar2,Am_TAIL,true);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(this);
  Am_Object::Set(selection_widget,0x169,pAVar2,0);
  Am_Value_List::~Am_Value_List(&local_88);
  Am_Object::~Am_Object(&prototype);
  Am_Value_List::~Am_Value_List(&selected_objs_places);
  Am_Object::~Am_Object(&place);
  Am_Object::~Am_Object(&new_group);
  return;
}

Assistant:

void
group_objects_internal(Am_Object &cmd, Am_Object &selection_widget,
                       Am_Value_List &selected_objs, Am_Object &group)
{
  Am_Object new_group, place;
  Am_Value_List selected_objs_places;
  cmd.Set(Am_OBJECT_MODIFIED, selected_objs);
  cmd.Set(Am_SAVED_OLD_OBJECT_OWNER, group);
  cmd.Set(Am_HAS_BEEN_UNDONE, false);

  Am_Object prototype = cmd.Get(Am_ITEM_PROTOTYPE);
  new_group =
      prototype.Create().Set(Am_CREATED_GROUP, true, Am_OK_IF_NOT_THERE);
  place = put_objects_into_group(selected_objs, selected_objs_places, group,
                                 new_group);
  cmd.Set(Am_OBJECT_MODIFIED_PLACES, selected_objs_places);
  group.Add_Part(new_group); //add to top
  if (place.Valid()) {
    Am_Move_Object(new_group, place, false); //put object before place
  }
  cmd.Set(Am_VALUE, new_group);
  //new selection is just the new group object
  selection_widget.Set(Am_VALUE, Am_Value_List().Add(new_group));
}